

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

bool wasm::Type::
     hasLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
               (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *types)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  _Node_const_iterator<wasm::Type,_true,_true> __tmp;
  _Hash_node_base *p_Var4;
  _Node_const_iterator<wasm::Type,_true,_true> __tmp_1;
  _Hash_node_base *p_Var5;
  bool bVar6;
  
  p_Var4 = (types->_M_h)._M_before_begin._M_nxt;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    bVar6 = false;
  }
  else {
    p_Var5 = p_Var4->_M_nxt;
    do {
      bVar6 = p_Var5 == (_Hash_node_base *)0x0;
      if (bVar6) {
        return bVar6;
      }
      p_Var1 = p_Var4->_M_nxt;
      p_Var2 = p_Var5->_M_nxt;
      bVar3 = hasLeastUpperBound((Type)p_Var4[1]._M_nxt,(Type)p_Var5[1]._M_nxt);
      p_Var4 = p_Var1;
      p_Var5 = p_Var2;
    } while (bVar3);
  }
  return bVar6;
}

Assistant:

static bool hasLeastUpperBound(const T& types) {
    auto first = types.begin(), end = types.end();
    if (first == end) {
      return false;
    }
    for (auto second = std::next(first); second != end;) {
      if (!hasLeastUpperBound(*first++, *second++)) {
        return false;
      }
    }
    return true;
  }